

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ambient_light.cpp
# Opt level: O2

Light_SampleRes *
embree::AmbientLight_sample
          (Light_SampleRes *__return_storage_ptr__,Light *super,DifferentialGeometry *dg,Vec2f *s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar6;
  undefined1 auVar5 [16];
  undefined1 auVar7 [12];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar11 [16];
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  vfloat4 a;
  float fVar23;
  float fVar24;
  Vec3fa localDir;
  float local_38;
  float fStack_34;
  float fStack_30;
  undefined4 uStack_2c;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_20;
  
  local_20.field_0 =
       *(anon_struct_8_2_947311e6_for_anon_union_8_2_4062524c_for_Vec2<float>_1_0 *)&s->field_0;
  cosineSampleHemisphere((embree *)&local_38,(Vec2f *)&local_20.field_0);
  fVar3 = (dg->Ns).field_0.m128[0];
  fVar6 = (dg->Ns).field_0.m128[2];
  fVar4 = -(dg->Ns).field_0.m128[1];
  fVar8 = -fVar6;
  auVar7._8_4_ = 0xffffffff;
  auVar7._0_8_ = 0xffffffffffffffff;
  if (fVar4 * fVar4 + fVar6 * fVar6 + 0.0 <= fVar3 * fVar3 + fVar8 * fVar8 + 0.0) {
    auVar7 = SUB1612((undefined1  [16])0x0,0);
  }
  fVar6 = (float)((uint)fVar6 & auVar7._4_4_);
  fVar8 = (float)(~auVar7._0_4_ & (uint)fVar8);
  fVar14 = (float)(~auVar7._8_4_ & (uint)fVar3 | (uint)fVar4 & auVar7._8_4_);
  fVar3 = fVar6 * fVar6;
  fVar4 = fVar14 * fVar14;
  fVar19 = fVar3 + fVar8 * fVar8 + fVar4;
  fVar20 = fVar3 + fVar3 + 0.0;
  fVar4 = fVar3 + fVar4 + fVar4;
  fVar3 = fVar3 + 0.0 + 0.0;
  auVar21._4_4_ = fVar20;
  auVar21._0_4_ = fVar19;
  auVar21._8_4_ = fVar4;
  auVar21._12_4_ = fVar3;
  auVar1._4_4_ = fVar20;
  auVar1._0_4_ = fVar19;
  auVar1._8_4_ = fVar4;
  auVar1._12_4_ = fVar3;
  auVar22 = rsqrtss(auVar21,auVar1);
  fVar3 = auVar22._0_4_;
  fVar9 = fVar3 * 1.5 - fVar3 * fVar3 * fVar19 * 0.5 * fVar3;
  fVar8 = fVar9 * fVar8;
  fVar6 = fVar9 * fVar6;
  fVar14 = fVar9 * fVar14;
  fVar9 = fVar9 * 0.0;
  fVar3 = (dg->Ns).field_0.m128[0];
  fVar4 = (dg->Ns).field_0.m128[1];
  fVar19 = (dg->Ns).field_0.m128[2];
  fVar20 = (dg->Ns).field_0.m128[3];
  fVar10 = fVar6 * fVar3 - fVar4 * fVar8;
  fVar12 = fVar14 * fVar4 - fVar19 * fVar6;
  fVar15 = fVar8 * fVar19 - fVar3 * fVar14;
  fVar17 = fVar9 * fVar20 - fVar20 * fVar9;
  fVar13 = fVar12 * fVar12;
  fVar16 = fVar15 * fVar15;
  fVar18 = fVar17 * fVar17;
  fVar23 = fVar16 + fVar13 + fVar10 * fVar10;
  fVar24 = fVar18 + fVar13 + fVar13;
  fVar16 = fVar16 + fVar13 + fVar16;
  fVar18 = fVar18 + fVar13 + fVar18;
  auVar11._4_4_ = fVar24;
  auVar11._0_4_ = fVar23;
  auVar11._8_4_ = fVar16;
  auVar11._12_4_ = fVar18;
  auVar2._4_4_ = fVar24;
  auVar2._0_4_ = fVar23;
  auVar2._8_4_ = fVar16;
  auVar2._12_4_ = fVar18;
  auVar22 = rsqrtss(auVar11,auVar2);
  fVar13 = auVar22._0_4_;
  fVar13 = fVar13 * 1.5 - fVar13 * fVar13 * fVar23 * 0.5 * fVar13;
  (__return_storage_ptr__->dir).field_0.m128[0] =
       local_38 * fVar8 + fStack_30 * fVar3 + fStack_34 * fVar13 * fVar12;
  (__return_storage_ptr__->dir).field_0.m128[1] =
       local_38 * fVar6 + fStack_30 * fVar4 + fStack_34 * fVar13 * fVar15;
  (__return_storage_ptr__->dir).field_0.m128[2] =
       local_38 * fVar14 + fStack_30 * fVar19 + fStack_34 * fVar13 * fVar10;
  (__return_storage_ptr__->dir).field_0.m128[3] =
       local_38 * fVar9 + fStack_30 * fVar20 + fStack_34 * fVar13 * fVar17;
  fVar3 = fStack_30 / 3.1415927;
  __return_storage_ptr__->pdf = fVar3;
  __return_storage_ptr__->dist = INFINITY;
  auVar5._4_4_ = uStack_2c;
  auVar5._0_4_ = fVar3;
  auVar5._8_4_ = fStack_30;
  auVar5._12_4_ = uStack_2c;
  auVar22._4_4_ = uStack_2c;
  auVar22._0_4_ = fVar3;
  auVar22._8_4_ = fStack_30;
  auVar22._12_4_ = uStack_2c;
  auVar22 = rcpss(auVar5,auVar22);
  fVar8 = (2.0 - fVar3 * auVar22._0_4_) * auVar22._0_4_;
  fVar3 = (float)super[5].type;
  fVar6 = (float)super[6].type;
  fVar4 = (float)super[7].type;
  (__return_storage_ptr__->weight).field_0.m128[0] = fVar8 * (float)super[4].type;
  (__return_storage_ptr__->weight).field_0.m128[1] = fVar8 * fVar3;
  (__return_storage_ptr__->weight).field_0.m128[2] = fVar8 * fVar6;
  (__return_storage_ptr__->weight).field_0.m128[3] = fVar8 * fVar4;
  return __return_storage_ptr__;
}

Assistant:

SYCL_EXTERNAL Light_SampleRes AmbientLight_sample(const Light* super,
                                                                 const DifferentialGeometry& dg,
                                                                 const Vec2f& s)
{
  AmbientLight* self = (AmbientLight*)super;
  Light_SampleRes res;

  const Vec3fa localDir = cosineSampleHemisphere(s);
  res.dir = frame(dg.Ns) * localDir;
  res.pdf = cosineSampleHemispherePDF(localDir);
  res.dist = inf;
  res.weight = self->radiance * rcp(res.pdf);

  return res;
}